

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O1

void anon_unknown.dwarf_2a21b2d::PrepBuffers<unsigned_char>
               (ACMRandom *rnd,int w,int h,int stride,int bd,bool trash_edges,uchar *data)

{
  uchar *puVar1;
  byte bVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  size_t __n;
  uchar *puVar7;
  long lVar8;
  long lVar9;
  uchar *puVar10;
  int i;
  long lVar11;
  ulong uVar12;
  
  FillEdge<unsigned_char>(rnd,stride << 5,bd,trash_edges,data);
  if (0 < h) {
    bVar2 = ~(byte)(-1 << ((byte)bd & 0x1f));
    lVar8 = (long)w;
    lVar9 = (long)stride;
    puVar7 = data + lVar9 * 0x20;
    puVar10 = data + lVar9 * 0x20 + lVar8 + 0x20;
    uVar6 = 0;
    do {
      puVar4 = data + (uVar6 + 0x20) * lVar9;
      if (trash_edges) {
        lVar11 = 0;
        do {
          uVar3 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar7[lVar11] = (byte)(uVar3 >> 0xf) & bVar2;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x20);
      }
      else {
        puVar4[0x10] = '\0';
        puVar4[0x11] = '\0';
        puVar4[0x12] = '\0';
        puVar4[0x13] = '\0';
        puVar4[0x14] = '\0';
        puVar4[0x15] = '\0';
        puVar4[0x16] = '\0';
        puVar4[0x17] = '\0';
        puVar4[0x18] = '\0';
        puVar4[0x19] = '\0';
        puVar4[0x1a] = '\0';
        puVar4[0x1b] = '\0';
        puVar4[0x1c] = '\0';
        puVar4[0x1d] = '\0';
        puVar4[0x1e] = '\0';
        puVar4[0x1f] = '\0';
        puVar4[0] = '\0';
        puVar4[1] = '\0';
        puVar4[2] = '\0';
        puVar4[3] = '\0';
        puVar4[4] = '\0';
        puVar4[5] = '\0';
        puVar4[6] = '\0';
        puVar4[7] = '\0';
        puVar4[8] = '\0';
        puVar4[9] = '\0';
        puVar4[10] = '\0';
        puVar4[0xb] = '\0';
        puVar4[0xc] = '\0';
        puVar4[0xd] = '\0';
        puVar4[0xe] = '\0';
        puVar4[0xf] = '\0';
      }
      if (0 < w) {
        uVar12 = 0;
        do {
          uVar3 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar7[uVar12 + 0x20] = (byte)(uVar3 >> 0xf) & bVar2;
          uVar12 = uVar12 + 1;
        } while ((uint)w != uVar12);
      }
      if (trash_edges) {
        lVar11 = 0;
        do {
          uVar3 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
          puVar10[lVar11] = (byte)(uVar3 >> 0xf) & bVar2;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x20);
      }
      else {
        puVar5 = puVar4 + lVar8 + 0x20;
        puVar1 = puVar4 + lVar8 + 0x30;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1 = puVar4 + lVar8 + 0x38;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar5[0] = '\0';
        puVar5[1] = '\0';
        puVar5[2] = '\0';
        puVar5[3] = '\0';
        puVar5[4] = '\0';
        puVar5[5] = '\0';
        puVar5[6] = '\0';
        puVar5[7] = '\0';
        puVar4 = puVar4 + lVar8 + 0x28;
        puVar4[0] = '\0';
        puVar4[1] = '\0';
        puVar4[2] = '\0';
        puVar4[3] = '\0';
        puVar4[4] = '\0';
        puVar4[5] = '\0';
        puVar4[6] = '\0';
        puVar4[7] = '\0';
      }
      uVar6 = uVar6 + 1;
      puVar7 = puVar7 + lVar9;
      puVar10 = puVar10 + lVar9;
    } while (uVar6 != (uint)h);
  }
  FillEdge<unsigned_char>(rnd,stride << 5,bd,trash_edges,data + (h + 0x20) * stride);
  __n = (size_t)((h + 0x40) * stride);
  memcpy(data + __n,data,__n);
  return;
}

Assistant:

void PrepBuffers(ACMRandom *rnd, int w, int h, int stride, int bd,
                 bool trash_edges, Pixel *data) {
  assert(rnd);
  const Pixel mask = (1 << bd) - 1;

  // Fill in the first buffer with random data
  // Top border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data);
  for (int r = 0; r < h; ++r) {
    Pixel *row_data = data + (kVPad + r) * stride;
    // Left border, contents, right border
    FillEdge(rnd, kHPad, bd, trash_edges, row_data);
    for (int c = 0; c < w; ++c) row_data[kHPad + c] = rnd->Rand16() & mask;
    FillEdge(rnd, kHPad, bd, trash_edges, row_data + kHPad + w);
  }
  // Bottom border
  FillEdge(rnd, stride * kVPad, bd, trash_edges, data + stride * (kVPad + h));

  const int bpp = sizeof(*data);
  const int block_elts = stride * (h + 2 * kVPad);
  const int block_size = bpp * block_elts;

  // Now copy that to the second buffer
  memcpy(data + block_elts, data, block_size);
}